

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.cpp
# Opt level: O0

void __thiscall libtorrent::bitfield::resize(bitfield *this,int bits)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  uint32_t *__src;
  int *piVar7;
  unsigned_long uVar8;
  unique_ptr<unsigned_int[],_long> local_28;
  unique_ptr<unsigned_int[],_long> b;
  int local_18;
  int cur_size_words;
  int new_size_words;
  int bits_local;
  bitfield *this_local;
  
  cur_size_words = bits;
  _new_size_words = this;
  iVar3 = size(this);
  if (bits != iVar3) {
    if (cur_size_words == 0) {
      std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::reset
                ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)this,
                 (nullptr_t)0x0);
    }
    else {
      local_18 = (cur_size_words + 0x1f) / 0x20;
      b.super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._4_4_ = num_words(this);
      if (b.super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
          super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._4_4_ == local_18) {
        uVar4 = libtorrent::aux::numeric_cast<unsigned_int,int,void>(cur_size_words);
        puVar6 = libtorrent::aux::unique_ptr<unsigned_int[],_long>::operator[](&this->m_buf,0);
        *puVar6 = uVar4;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(local_18 + 1);
        uVar5 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        puVar6 = (uint *)operator_new__(uVar5);
        libtorrent::aux::unique_ptr<unsigned_int[],_long>::unique_ptr(&local_28,puVar6);
        uVar4 = libtorrent::aux::numeric_cast<unsigned_int,int,void>(cur_size_words);
        puVar6 = libtorrent::aux::unique_ptr<unsigned_int[],_long>::operator[](&local_28,0);
        *puVar6 = uVar4;
        bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
        if (bVar2) {
          puVar6 = libtorrent::aux::unique_ptr<unsigned_int[],_long>::operator[](&local_28,1);
          __src = buf(this);
          piVar7 = std::min<int>(&local_18,
                                 (int *)((long)&b.
                                                super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                                                ._M_t.
                                                super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                                .super__Head_base<0UL,_unsigned_int_*,_false> + 4));
          uVar8 = libtorrent::aux::numeric_cast<unsigned_long,int,void>(*piVar7 << 2);
          memcpy(puVar6,__src,uVar8);
        }
        if (b.super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._4_4_ < local_18) {
          puVar6 = libtorrent::aux::unique_ptr<unsigned_int[],_long>::operator[]
                             (&local_28,
                              (long)(b.
                                     super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                     .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl.
                                     _4_4_ + 1));
          uVar8 = libtorrent::aux::numeric_cast<unsigned_long,int,void>
                            ((local_18 -
                             b.
                             super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
                             _M_t.
                             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                             .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl._4_4_) * 4);
          memset(puVar6,0,uVar8);
        }
        libtorrent::aux::unique_ptr<unsigned_int[],_long>::operator=(&this->m_buf,&local_28);
        libtorrent::aux::unique_ptr<unsigned_int[],_long>::~unique_ptr(&local_28);
      }
      clear_trailing_bits(this);
    }
  }
  return;
}

Assistant:

void bitfield::resize(int const bits)
	{
		if (bits == size()) return;

		TORRENT_ASSERT(bits >= 0);
		if (bits == 0)
		{
			m_buf.reset();
			return;
		}
		int const new_size_words = (bits + 31) / 32;
		int const cur_size_words = num_words();
		if (cur_size_words != new_size_words)
		{
			aux::unique_ptr<std::uint32_t[]> b(new std::uint32_t[std::size_t(new_size_words + 1)]);
#ifdef BOOST_NO_EXCEPTIONS
			if (b == nullptr) std::terminate();
#endif
			b[0] = aux::numeric_cast<std::uint32_t>(bits);
			if (m_buf) std::memcpy(&b[1], buf()
				, aux::numeric_cast<std::size_t>(std::min(new_size_words, cur_size_words) * 4));
			if (new_size_words > cur_size_words)
			{
				std::memset(&b[1 + cur_size_words], 0
					, aux::numeric_cast<std::size_t>((new_size_words - cur_size_words) * 4));
			}
			m_buf = std::move(b);
		}
		else
		{
			m_buf[0] = aux::numeric_cast<std::uint32_t>(bits);
		}

		clear_trailing_bits();
		TORRENT_ASSERT(size() == bits);
	}